

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

bool deqp::egl::compareCorners(Surface *oldSurface,Surface *newSurface)

{
  bool bVar1;
  int x;
  int x_00;
  int y;
  int y_00;
  int width;
  int height;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  ConstPixelBufferAccess local_f0;
  undefined1 local_c8 [8];
  ConstPixelBufferAccess newAccess;
  undefined1 local_78 [8];
  ConstPixelBufferAccess oldAccess;
  int newY;
  int oldY;
  int yCorner;
  int newX;
  int oldX;
  int xCorner;
  int minHeight;
  int minWidth;
  int newHeight;
  int newWidth;
  int oldHeight;
  int oldWidth;
  Surface *newSurface_local;
  Surface *oldSurface_local;
  
  x = tcu::Surface::getWidth(oldSurface);
  x_00 = tcu::Surface::getHeight(oldSurface);
  y = tcu::Surface::getWidth(newSurface);
  y_00 = tcu::Surface::getHeight(newSurface);
  width = de::min<int>(x,y);
  height = de::min<int>(x_00,y_00);
  newX = 0;
  do {
    if (1 < newX) {
      return false;
    }
    if (newX == 0) {
      local_f4 = 0;
      local_f8 = 0;
    }
    else {
      local_f4 = x - width;
      local_f8 = y - width;
    }
    for (newY = 0; newY < 2; newY = newY + 1) {
      if (newY == 0) {
        local_fc = 0;
      }
      else {
        local_fc = x_00 - height;
      }
      oldAccess.m_data._4_4_ = local_fc;
      if (newY == 0) {
        local_100 = 0;
      }
      else {
        local_100 = y_00 - height;
      }
      oldAccess.m_data._0_4_ = local_100;
      tcu::Surface::getAccess((ConstPixelBufferAccess *)&newAccess.m_data,oldSurface);
      tcu::getSubregion((ConstPixelBufferAccess *)local_78,
                        (ConstPixelBufferAccess *)&newAccess.m_data,local_f4,oldAccess.m_data._4_4_,
                        width,height);
      tcu::Surface::getAccess(&local_f0,newSurface);
      tcu::getSubregion((ConstPixelBufferAccess *)local_c8,&local_f0,local_f8,(int)oldAccess.m_data,
                        width,height);
      bVar1 = compareRectangles((ConstPixelBufferAccess *)local_78,
                                (ConstPixelBufferAccess *)local_c8);
      if (bVar1) {
        return true;
      }
    }
    newX = newX + 1;
  } while( true );
}

Assistant:

bool compareCorners (const Surface& oldSurface, const Surface& newSurface)
{
	const int	oldWidth	= oldSurface.getWidth();
	const int	oldHeight	= oldSurface.getHeight();
	const int	newWidth	= newSurface.getWidth();
	const int	newHeight	= newSurface.getHeight();
	const int	minWidth	= de::min(oldWidth, newWidth);
	const int	minHeight	= de::min(oldHeight, newHeight);

	for (int xCorner = 0; xCorner < 2; ++xCorner)
	{
		const int oldX = xCorner == 0 ? 0 : oldWidth - minWidth;
		const int newX = xCorner == 0 ? 0 : newWidth - minWidth;

		for (int yCorner = 0; yCorner < 2; ++yCorner)
		{
			const int				oldY		= yCorner == 0 ? 0 : oldHeight - minHeight;
			const int				newY		= yCorner == 0 ? 0 : newHeight - minHeight;
			ConstPixelBufferAccess	oldAccess	=
				getSubregion(oldSurface.getAccess(), oldX, oldY, minWidth, minHeight);
			ConstPixelBufferAccess	newAccess	=
				getSubregion(newSurface.getAccess(), newX, newY, minWidth, minHeight);

			if (compareRectangles(oldAccess, newAccess))
				return true;
		}
	}

	return false;
}